

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaL_register(lua_State *L,char *libname,luaL_Reg *l)

{
  luaL_Reg *l_local;
  char *libname_local;
  lua_State *L_local;
  
  luaI_openlib(L,libname,l,0);
  return;
}

Assistant:

static void luaL_register(lua_State*L,const char*libname,
const luaL_Reg*l){
luaI_openlib(L,libname,l,0);
}